

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_CompactRepeatedFieldPrinter_Test::
TextFormatTest_CompactRepeatedFieldPrinter_Test
          (TextFormatTest_CompactRepeatedFieldPrinter_Test *this)

{
  TextFormatTest_CompactRepeatedFieldPrinter_Test *this_local;
  
  TextFormatTest::TextFormatTest(&this->super_TextFormatTest);
  (this->super_TextFormatTest).super_TextFormatTestBase.super_Test._vptr_Test =
       (_func_int **)&PTR__TextFormatTest_CompactRepeatedFieldPrinter_Test_029eeb10;
  return;
}

Assistant:

TEST_F(TextFormatTest, CompactRepeatedFieldPrinter) {
  TextFormat::Printer printer;
  ASSERT_TRUE(printer.RegisterFieldValuePrinter(
      unittest::TestAllTypes::default_instance()
          .descriptor()
          ->FindFieldByNumber(
              unittest::TestAllTypes::kRepeatedNestedMessageFieldNumber),
      new CompactRepeatedFieldPrinter));

  proto2_unittest::TestAllTypes message;
  message.add_repeated_nested_message()->set_bb(1);
  message.add_repeated_nested_message()->set_bb(2);
  message.add_repeated_nested_message()->set_bb(3);

  std::string text;
  ASSERT_TRUE(printer.PrintToString(message, &text));
  EXPECT_EQ(
      "repeated_nested_message {\n"
      "  bb: 1\n"
      "  bb: 2\n"
      "  bb: 3\n"
      "}\n",
      text);
}